

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_BasicGroundCombatVehicle.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::GED_BasicGroundCombatVehicle::GED_BasicGroundCombatVehicle
          (GED_BasicGroundCombatVehicle *this)

{
  DataTypeBase::DataTypeBase((DataTypeBase *)this);
  (this->super_GED).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__GED_BasicGroundCombatVehicle_0022a978;
  this->m_ui16EntityID = 0;
  DATA_TYPE::EntityAppearance::EntityAppearance(&this->m_EA);
  this->m_i16Offsets[2] = 0;
  this->m_i16Offsets[0] = 0;
  this->m_i16Offsets[1] = 0;
  this->m_i8Ori[0] = '\0';
  this->m_i8Ori[1] = '\0';
  this->m_i8Ori[2] = '\0';
  this->m_i8Spd = '\0';
  this->m_i8TrrtAz = '\0';
  this->m_i8GnElv = '\0';
  this->m_i8TrrtSlwRt = '\0';
  this->m_i8GnElvRt = '\0';
  return;
}

Assistant:

GED_BasicGroundCombatVehicle::GED_BasicGroundCombatVehicle() :
    m_ui16EntityID( 0 ),
    m_i8Spd( 0 ),
    m_i8TrrtAz( 0 ),
    m_i8GnElv( 0 ),
    m_i8TrrtSlwRt( 0 ),
    m_i8GnElvRt( 0 )
{
    for( KINT8 i = 0; i < 3; ++i )
    {
        m_i16Offsets[i] = 0;
        m_i8Ori[i] = 0;
    }
}